

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

bool __thiscall argo::json::operator==(json *this,json *other)

{
  type tVar1;
  type tVar2;
  bool bVar3;
  json_exception *this_00;
  double dVar4;
  double dVar5;
  
  tVar1 = this->m_type;
  tVar2 = other->m_type;
  if (tVar1 == tVar2) {
    switch(tVar1) {
    case object_e:
      bVar3 = object_equal(this,other);
      return bVar3;
    case array_e:
      bVar3 = array_equal(this,other);
      return bVar3;
    case boolean_e:
      bVar3 = (this->m_value).u_boolean == (other->m_value).u_boolean;
      break;
    case null_e:
      bVar3 = true;
      break;
    case number_int_e:
    case number_double_e:
      bVar3 = number_equal(this,other);
      return bVar3;
    case string_e:
      bVar3 = string_equal(this,other);
      return bVar3;
    default:
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      json_exception::json_exception(this_00,invalid_json_type_e);
      __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
    }
  }
  else if ((tVar2 == number_double_e && tVar1 == number_int_e) ||
          (tVar2 == number_int_e && tVar1 == number_double_e)) {
    dVar4 = operator_cast_to_double(this);
    dVar5 = operator_cast_to_double(other);
    bVar3 = (bool)(-(dVar5 == dVar4) & 1);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool json::operator==(const json &other) const
{
    if (m_type == other.m_type)
    {
        switch (m_type)
        {
        case object_e:
            return object_equal(other);
        case array_e:
            return array_equal(other);
        case boolean_e:
            return m_value.u_boolean == other.m_value.u_boolean;
        case null_e:
            return true;
        case number_int_e:
            return number_equal(other);
        case number_double_e:
            return number_equal(other);
        case string_e:
            return string_equal(other);
        default:
            throw json_exception(json_exception::invalid_json_type_e);
        }
    }
    else if ((m_type == number_int_e && other.m_type == number_double_e) ||
             (m_type == number_double_e && other.m_type == number_int_e))
    {
        return static_cast<double>(*this) == static_cast<double>(other);
    }
    else
    {
        return false;
    }
}